

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privparent.c
# Opt level: O2

void privop_pasv_listen(session_t *sess)

{
  int iVar1;
  socklen_t sa_in_len;
  sockaddr_in sa_in;
  char local_ip [16];
  
  local_ip[0] = '\0';
  local_ip[1] = '\0';
  local_ip[2] = '\0';
  local_ip[3] = '\0';
  local_ip[4] = '\0';
  local_ip[5] = '\0';
  local_ip[6] = '\0';
  local_ip[7] = '\0';
  local_ip[8] = '\0';
  local_ip[9] = '\0';
  local_ip[10] = '\0';
  local_ip[0xb] = '\0';
  local_ip[0xc] = '\0';
  local_ip[0xd] = '\0';
  local_ip[0xe] = '\0';
  local_ip[0xf] = '\0';
  getlocalip(local_ip);
  iVar1 = tcp_server(local_ip,0);
  sess->pasv_listen_fd = iVar1;
  sa_in_len = 0x10;
  iVar1 = getsockname(iVar1,(sockaddr *)&sa_in,&sa_in_len);
  if (-1 < iVar1) {
    priv_sock_send_int(sess->parent_fd,(uint)(ushort)(sa_in.sin_port << 8 | sa_in.sin_port >> 8));
    return;
  }
  perror("getsockname");
  exit(1);
}

Assistant:

void privop_pasv_listen(session_t *sess) {
  char local_ip[16] = {0};
  getlocalip(local_ip);

  sess->pasv_listen_fd = tcp_server(local_ip, 0);
  struct sockaddr_in sa_in;
  socklen_t sa_in_len = sizeof(sa_in);
  if (getsockname(sess->pasv_listen_fd, (struct sockaddr *) &sa_in, &sa_in_len) < 0) {
    ERR_EXIT("getsockname");
  }

  unsigned short port = ntohs(sa_in.sin_port);

  priv_sock_send_int(sess->parent_fd, (int) port);
}